

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue
          (ZEeventsChecker *this,ze_event_handle_t hEvent,ze_result_t result)

{
  bool bVar1;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_38;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_30;
  ze_result_t local_24;
  ze_event_handle_t p_Stack_20;
  ze_result_t result_local;
  ze_event_handle_t hEvent_local;
  ZEeventsChecker *this_local;
  
  if (result == ZE_RESULT_SUCCESS) {
    local_24 = result;
    p_Stack_20 = hEvent;
    hEvent_local = (ze_event_handle_t)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::find(&this->eventToDagID,&stack0xffffffffffffffe0);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::end(&this->eventToDagID);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar1) {
      std::
      unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
      ::erase(&this->eventToDagID,&stack0xffffffffffffffe0);
    }
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue(
    ze_event_handle_t hEvent, ///< [in][release] handle of event object to destroy
    ze_result_t result
) {
    if(result != ZE_RESULT_SUCCESS) {
        return ZE_RESULT_SUCCESS;
    }

    if (eventToDagID.find(hEvent) != eventToDagID.end()) {
        // Delete event from eventToDagID but not from the dagIDToAction map as it may be needed for printing the discription of the action when printing path in the DAG.
        eventToDagID.erase(hEvent);
    }

    return ZE_RESULT_SUCCESS;
}